

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

int __thiscall IlmThread_3_2::ThreadPool::numThreads(ThreadPool *this)

{
  int iVar1;
  ProviderPtr sp;
  shared_ptr<IlmThread_3_2::ThreadPoolProvider> local_18;
  
  std::atomic_load<IlmThread_3_2::ThreadPoolProvider>(&local_18);
  if (local_18.super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (*(local_18.
               super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ThreadPoolProvider[2])();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.
              super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar1;
}

Assistant:

int
ThreadPool::numThreads () const
{
#ifdef ENABLE_THREADING
    Data::ProviderPtr sp = _data->getProvider ();
    return (sp) ? sp->numThreads () : 0;
#else
    return 0;
#endif
}